

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O0

bool tcu::astc::anon_unknown_0::isColorEndpointModeHDR(deUint32 mode)

{
  undefined1 local_d;
  deUint32 mode_local;
  
  local_d = true;
  if ((((mode != 2) && (local_d = true, mode != 3)) && (local_d = true, mode != 7)) &&
     ((local_d = true, mode != 0xb && (local_d = true, mode != 0xe)))) {
    local_d = mode == 0xf;
  }
  return local_d;
}

Assistant:

inline bool isColorEndpointModeHDR (deUint32 mode)
{
	return mode == 2	||
		   mode == 3	||
		   mode == 7	||
		   mode == 11	||
		   mode == 14	||
		   mode == 15;
}